

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall Potassco::AspifTextOutput::beginStep(AspifTextOutput *this)

{
  ostream *poVar1;
  
  if (-1 < this->step_) {
    poVar1 = this->os_;
    if (this->step_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"% #program base.\n",0x11);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"% #program step(",0x10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->step_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,").\n",3);
      TheoryData::update(&this->theory_);
    }
    this->step_ = this->step_ + 1;
    this->startAtom_ =
         (Atom_t)((ulong)((long)(this->data_->atoms).
                                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->data_->atoms).
                               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return;
}

Assistant:

void AspifTextOutput::beginStep() {
	if (step_ >= 0) {
		if (step_) { os_ << "% #program step(" << step_ << ").\n"; theory_.update(); }
		else       { os_ << "% #program base.\n"; }
		++step_;
		startAtom_ = data_->atoms.size();
	}
}